

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsBinarySemaphore.h
# Opt level: O3

void __thiscall
HighsBinarySemaphore::acquire(HighsBinarySemaphore *this,unique_lock<std::mutex> *lockGuard)

{
  int iVar1;
  _Head_base<0UL,_HighsBinarySemaphore::Data_*,_false> _Var2;
  
  _Var2._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_HighsBinarySemaphore::Data_*,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
       .super__Head_base<0UL,_HighsBinarySemaphore::Data_*,_false>._M_head_impl;
  LOCK();
  iVar1 = *(int *)&(_Var2._M_head_impl)->count;
  (_Var2._M_head_impl)->count = (__atomic_base<int>)0xffffffff;
  UNLOCK();
  _Var2._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_HighsBinarySemaphore::Data_*,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
       .super__Head_base<0UL,_HighsBinarySemaphore::Data_*,_false>._M_head_impl;
  while (iVar1 != 1) {
    std::condition_variable::wait((unique_lock *)&(_Var2._M_head_impl)->condvar);
    _Var2._M_head_impl =
         (this->data_)._M_t.
         super___uniq_ptr_impl<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
         ._M_t.
         super__Tuple_impl<0UL,_HighsBinarySemaphore::Data_*,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
         .super__Head_base<0UL,_HighsBinarySemaphore::Data_*,_false>._M_head_impl;
    iVar1 = *(int *)&(_Var2._M_head_impl)->count;
  }
  ((_Var2._M_head_impl)->count).super___atomic_base<int> = (__atomic_base<int>)0x0;
  return;
}

Assistant:

void acquire(std::unique_lock<std::mutex> lockGuard) {
    int prev = data_->count.exchange(-1, std::memory_order_relaxed);
    if (prev == 1) {
      data_->count.store(0, std::memory_order_relaxed);
      return;
    }

    do {
      data_->condvar.wait(lockGuard);
    } while (data_->count.load(std::memory_order_relaxed) != 1);

    data_->count.store(0, std::memory_order_relaxed);
  }